

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

Status __thiscall leveldb::BlockHandle::DecodeFrom(BlockHandle *this,Slice *input)

{
  bool bVar1;
  Slice *in_RDX;
  Slice local_38;
  Slice local_28;
  
  bVar1 = GetVarint64(in_RDX,(uint64_t *)input);
  if ((bVar1) && (bVar1 = GetVarint64(in_RDX,&input->size_), bVar1)) {
    this->offset_ = 0;
    return (Status)(char *)this;
  }
  local_28.data_ = "bad block handle";
  local_28.size_ = 0x10;
  local_38.data_ = "";
  local_38.size_ = 0;
  Status::Status((Status *)this,kCorruption,&local_28,&local_38);
  return (Status)(char *)this;
}

Assistant:

Status BlockHandle::DecodeFrom(Slice* input) {
  if (GetVarint64(input, &offset_) &&
      GetVarint64(input, &size_)) {
    return Status::OK();
  } else {
    return Status::Corruption("bad block handle");
  }
}